

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test::testBody
          (TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test *this)

{
  TestTestingFixture *this_00;
  UtestShell *pUVar1;
  size_t sVar2;
  TestTerminator *pTVar3;
  SimpleString local_28;
  
  TestTestingFixture::setTestFunction
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).fixture,
             testLeakWarningWithPluginDisabled_);
  MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
  TestTestingFixture::runAllTests
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).fixture);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = TestTestingFixture::getFailureCount
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).fixture);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,0,sVar2,"LONGS_EQUAL(0, fixture->getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x91,pTVar3);
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).fixture;
  SimpleString::SimpleString
            (&local_28,"Warning: Expected 1 leak(s), but leak detection was disabled");
  TestTestingFixture::assertPrintContains(this_00,&local_28);
  SimpleString::~SimpleString(&local_28);
  cpputest_free_location_with_leak_detection
            (leak1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x94);
  leak1 = (char *)0x0;
  MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningTest, LeakWarningWithPluginDisabled)
{
    fixture->setTestFunction(testLeakWarningWithPluginDisabled_);

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

    fixture->runAllTests();

    LONGS_EQUAL(0, fixture->getFailureCount());
    fixture->assertPrintContains("Warning: Expected 1 leak(s), but leak detection was disabled");

    cpputest_free_location_with_leak_detection(leak1, __FILE__, __LINE__);
    leak1 = NULLPTR;

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
}